

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O1

void duckdb::TimeBucketOffsetFunction<duckdb::date_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  char cVar1;
  reference a;
  reference b;
  reference c;
  long lVar2;
  code *fun;
  interval_t local_38;
  
  a = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  b = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  c = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,2);
  if (*a != (value_type)0x2) {
    TernaryExecutor::
    ExecuteGeneric<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t,duckdb::TernaryLambdaWrapper,duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t,duckdb::interval_t)>
              (a,b,c,result,*(idx_t *)(args + 0x18),
               TimeBucket::OffsetTernaryOperator::
               Operation<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t>);
    return;
  }
  if ((*(byte **)(a + 0x28) != (byte *)0x0) && ((**(byte **)(a + 0x28) & 1) == 0)) {
    duckdb::Vector::SetVectorType((VectorType)result);
    duckdb::ConstantVector::SetNull(result,true);
    return;
  }
  local_38._0_8_ = **(undefined8 **)(a + 0x20);
  local_38.micros = (*(undefined8 **)(a + 0x20))[1];
  if (local_38.months == 0) {
    lVar2 = duckdb::Interval::GetMicro(&local_38);
    if (0 < lVar2) {
      cVar1 = '\0';
      goto LAB_005b2f0f;
    }
  }
  cVar1 = '\x02' - ((local_38.micros == 0 && local_38.days == 0) && 0 < local_38.months);
LAB_005b2f0f:
  if (cVar1 == '\x02') {
    fun = TimeBucket::OffsetTernaryOperator::
          Operation<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t>;
  }
  else if (cVar1 == '\x01') {
    fun = TimeBucket::OffsetWidthConvertibleToMonthsTernaryOperator::
          Operation<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t>;
  }
  else {
    fun = TimeBucket::OffsetWidthConvertibleToMicrosTernaryOperator::
          Operation<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t>;
  }
  TernaryExecutor::
  ExecuteGeneric<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t,duckdb::TernaryLambdaWrapper,duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t,duckdb::interval_t)>
            (a,b,c,result,*(idx_t *)(args + 0x18),fun);
  return;
}

Assistant:

static void TimeBucketOffsetFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 3);

	auto &bucket_width_arg = args.data[0];
	auto &ts_arg = args.data[1];
	auto &offset_arg = args.data[2];

	if (bucket_width_arg.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		if (ConstantVector::IsNull(bucket_width_arg)) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
		} else {
			interval_t bucket_width = *ConstantVector::GetData<interval_t>(bucket_width_arg);
			TimeBucket::BucketWidthType bucket_width_type = TimeBucket::ClassifyBucketWidth(bucket_width);
			switch (bucket_width_type) {
			case TimeBucket::BucketWidthType::CONVERTIBLE_TO_MICROS:
				TernaryExecutor::Execute<interval_t, T, interval_t, T>(
				    bucket_width_arg, ts_arg, offset_arg, result, args.size(),
				    TimeBucket::OffsetWidthConvertibleToMicrosTernaryOperator::Operation<interval_t, T, interval_t, T>);
				break;
			case TimeBucket::BucketWidthType::CONVERTIBLE_TO_MONTHS:
				TernaryExecutor::Execute<interval_t, T, interval_t, T>(
				    bucket_width_arg, ts_arg, offset_arg, result, args.size(),
				    TimeBucket::OffsetWidthConvertibleToMonthsTernaryOperator::Operation<interval_t, T, interval_t, T>);
				break;
			case TimeBucket::BucketWidthType::UNCLASSIFIED:
				TernaryExecutor::Execute<interval_t, T, interval_t, T>(
				    bucket_width_arg, ts_arg, offset_arg, result, args.size(),
				    TimeBucket::OffsetTernaryOperator::Operation<interval_t, T, interval_t, T>);
				break;
			default:
				throw NotImplementedException("Bucket type not implemented for TIME_BUCKET");
			}
		}
	} else {
		TernaryExecutor::Execute<interval_t, T, interval_t, T>(
		    bucket_width_arg, ts_arg, offset_arg, result, args.size(),
		    TimeBucket::OffsetTernaryOperator::Operation<interval_t, T, interval_t, T>);
	}
}